

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O0

int ON_SubDFacePtr::Compare(ON_SubDFacePtr *lhs,ON_SubDFacePtr *rhs)

{
  ON_SubDFacePtr *rhs_local;
  ON_SubDFacePtr *lhs_local;
  
  if (lhs == (ON_SubDFacePtr *)0x0) {
    lhs_local._4_4_ = 1;
  }
  else if (rhs == (ON_SubDFacePtr *)0x0) {
    lhs_local._4_4_ = -1;
  }
  else if (lhs->m_ptr < rhs->m_ptr) {
    lhs_local._4_4_ = -1;
  }
  else if (rhs->m_ptr < lhs->m_ptr) {
    lhs_local._4_4_ = 1;
  }
  else {
    lhs_local._4_4_ = 0;
  }
  return lhs_local._4_4_;
}

Assistant:

int ON_SubDFacePtr::Compare(
  const ON_SubDFacePtr* lhs,
  const ON_SubDFacePtr* rhs
)
{
  if ( nullptr == lhs )
    return 1;
  if ( nullptr == rhs )
    return -1;

  if (lhs->m_ptr < rhs->m_ptr)
    return -1;
  if (lhs->m_ptr > rhs->m_ptr)
    return 1;

  return 0;
}